

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

void __thiscall
vkb::PhysicalDeviceSelector::PhysicalDeviceSelector
          (PhysicalDeviceSelector *this,Instance *instance,VkSurfaceKHR surface)

{
  (this->instance_info).instance = (VkInstance)0x0;
  (this->instance_info).surface = (VkSurfaceKHR)0x0;
  (this->instance_info).version = 0x400000;
  (this->instance_info).headless = false;
  (this->instance_info).properties2_ext_enabled = false;
  SelectionCriteria::SelectionCriteria(&this->criteria);
  (this->instance_info).instance = instance->instance;
  (this->instance_info).version = instance->instance_version;
  (this->instance_info).properties2_ext_enabled = instance->properties2_ext_enabled;
  (this->instance_info).surface = surface;
  (this->criteria).require_present = (bool)(instance->headless ^ 1);
  (this->criteria).required_version = instance->api_version;
  return;
}

Assistant:

PhysicalDeviceSelector::PhysicalDeviceSelector(Instance const& instance, VkSurfaceKHR surface) {
    instance_info.instance = instance.instance;
    instance_info.version = instance.instance_version;
    instance_info.properties2_ext_enabled = instance.properties2_ext_enabled;
    instance_info.surface = surface;
    criteria.require_present = !instance.headless;
    criteria.required_version = instance.api_version;
}